

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O1

void __thiscall Refal2::CSetBuilder<int>::Exclude(CSetBuilder<int> *this,int *element)

{
  CSet tmp;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> _Stack_38;
  
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_38._M_impl.super__Rb_tree_header._M_header;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&_Stack_38,
             element);
  Exclude(this,(CSet *)&_Stack_38);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&_Stack_38);
  return;
}

Assistant:

void CSetBuilder<T>::Exclude( const T& element )
{
	CSet tmp;
	tmp.insert( element );
	Exclude( tmp );
}